

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

Am_Object __thiscall Am_Object::Copy(Am_Object *this,char *new_name)

{
  unsigned_short *puVar1;
  Am_Constraint_Context *pAVar2;
  Am_Object_Data *pAVar3;
  char *in_RDX;
  Am_Object *new_object;
  
  pAVar3 = *(Am_Object_Data **)new_name;
  if (pAVar3 == (Am_Object_Data *)0x0) {
    Am_Object(this,&Am_Root_Object);
  }
  else {
    if ((short)pAVar3->demons_active < 0) {
      Am_Demon_Queue::Invoke(&pAVar3->demon_queue);
      pAVar3 = *(Am_Object_Data **)new_name;
    }
    this->data = (Am_Object_Data *)0x0;
    pAVar3 = Am_Object_Data::copy_object(pAVar3,in_RDX);
    this->data = pAVar3;
    puVar1 = &((pAVar3->demon_queue).data)->invoke_stack;
    *puVar1 = *puVar1 + 1;
    pAVar2 = cc;
    cc = Am_Empty_Constraint_Context;
    Am_Object_Data::invoke_copy_demons(pAVar3);
    pAVar3 = this->data;
    puVar1 = &((pAVar3->demon_queue).data)->invoke_stack;
    cc = pAVar2;
    *puVar1 = *puVar1 - 1;
    Am_Object_Data::validate_object(pAVar3);
    Am_Object_Data::note_parts(this->data);
  }
  return (Am_Object)(Am_Object_Data *)this;
}

Assistant:

Am_Object
Am_Object::Copy(const char *new_name) const
{
  if (data) {
    if (data->demons_active & DEMONS_ACTIVE)
      data->demon_queue.Invoke();
    Am_Object new_object;
    new_object.data = data->copy_object(new_name);
    new_object.data->demon_queue.Prevent_Invoke();
    Am_PUSH_EMPTY_CC() new_object.data->invoke_copy_demons();
    Am_POP_EMPTY_CC() new_object.data->demon_queue.Release_Invoke();
    new_object.data->validate_object();
    new_object.data->note_parts();
#ifdef DEBUG
    Global_Call_Object_Trace(*this, new_object, Am_TRACE_OBJECT_COPIED);
#endif
    return new_object;
  } else
    return Am_Root_Object;
}